

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::AutoArray(NULLCAutoArray *arr,int type,uint count)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  if ((uint)type < *(uint *)(linker + 0x20c)) {
    uVar1 = *(uint *)(*(long *)(linker + 0x200) + 4 + (ulong)(uint)type * 0x50);
    uVar3 = (ulong)count * (ulong)uVar1;
    if (globalMemoryLimit <= uVar3 && uVar3 - globalMemoryLimit != 0) {
      nullcThrowError("ERROR: can\'t allocate array with %u elements of size %u",(ulong)count,
                      (ulong)uVar1);
      return;
    }
    arr->typeID = type;
    arr->len = count;
    pcVar2 = (char *)AllocObject(count * uVar1,type);
    arr->ptr = pcVar2;
    return;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void NULLC::AutoArray(NULLCAutoArray* arr, int type, unsigned count)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if((unsigned long long)count * linker->exTypes[type].size > globalMemoryLimit)
	{
		nullcThrowError("ERROR: can't allocate array with %u elements of size %u", count, linker->exTypes[type].size);
		return;
	}

	arr->typeID = type;
	arr->len = count;
	arr->ptr = (char*)AllocObject(count * linker->exTypes[type].size, type);
}